

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O3

string * __thiscall
json::JsonLexer::readNumber_abi_cxx11_
          (string *__return_storage_ptr__,JsonLexer *this,istream *input,char previous)

{
  byte bVar1;
  uint uVar2;
  runtime_error *this_00;
  istream *input_00;
  istream *input_01;
  istream *input_02;
  char c;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((char)input == '-') {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::istream::get((char *)this);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"After a minus sign there must be at least one digit")
    ;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  if ((char)input != '0') {
    readDigits_abi_cxx11_(&local_40,this,input_00);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) != 0) {
    return __return_storage_ptr__;
  }
  bVar1 = std::istream::peek();
  if (bVar1 == 0x2e) {
    readFraction_abi_cxx11_(&local_40,this,input_01);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) != 0) {
      return __return_storage_ptr__;
    }
    uVar2 = std::istream::peek();
    if ((uVar2 & 0xdf) != 0x45) {
      return __return_storage_ptr__;
    }
    readExponent_abi_cxx11_(&local_40,this,input_02);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if ((bVar1 & 0xdf) != 0x45) {
      return __return_storage_ptr__;
    }
    readExponent_abi_cxx11_(&local_40,this,input_01);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_40._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonLexer::readNumber(std::istream &input, char previous)
    {
        std::string number;
        char c = previous;

        // Check for optional minus.
        if (c == '-')
        {
            number += c;
            if (!(input.get(c)) || !isdigit(c))
                throw std::runtime_error("After a minus sign there must be at least one digit");
        }

        number += c;

        // We only want to continue to append digits if the number
        // doesn't start with zero. For example "0123" is not a valid number.
        if (c != '0')
        {
            number += readDigits(input);
        }

        // Check for optional fraction and exponent.
        if (!input.eof())
        {
            c = static_cast<char>(input.peek());
            if (c == '.')
            {
                number += readFraction(input);
                if (!input.eof())
                {
                    c = static_cast<char>(input.peek());
                    if (c == 'e' || c == 'E')
                    {
                        number += readExponent(input);
                    }
                }
            }
            else if (c == 'e' || c == 'E')
            {
                number += readExponent(input);
            }
        }

        return number;
    }